

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_Dsd6DecomposeSingleVarOne(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars,int v)

{
  ulong uVar1;
  byte bVar2;
  word wVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = *pTruth;
  uVar1 = s_Truths6Neg[v];
  if ((uVar5 & 1) == 0) {
    if ((uVar1 & uVar5) != 0) {
LAB_00433dc7:
      uVar4 = s_Truths6[v] & uVar5;
      if ((long)uVar5 < 0) {
        if (uVar4 == s_Truths6[v]) {
          Dau_DsdWriteString(p,"!(!");
          uVar5 = Abc_Tt6Cofactor0(*pTruth,v);
          goto LAB_00433e1e;
        }
      }
      else if (uVar4 == 0) {
        Dau_DsdWriteString(p,"(!");
        wVar3 = Abc_Tt6Cofactor0(*pTruth,v);
        goto LAB_00433e21;
      }
      bVar2 = (byte)v & 0x1f;
      if ((uVar1 & ~(uVar5 >> ((byte)(1 << bVar2) & 0x3f) ^ uVar5)) != 0) {
        return 0 << bVar2;
      }
      Dau_DsdWriteString(p,"[");
      wVar3 = Abc_Tt6Cofactor0(*pTruth,v);
      *pTruth = wVar3;
      p->uConstMask = p->uConstMask | 1 << ((byte)p->nConsts & 0x1f);
      goto LAB_00433e24;
    }
    Dau_DsdWriteString(p,"(");
    wVar3 = Abc_Tt6Cofactor1(*pTruth,v);
  }
  else {
    if ((uVar1 & uVar5) != uVar1) goto LAB_00433dc7;
    Dau_DsdWriteString(p,"!(");
    uVar5 = Abc_Tt6Cofactor1(*pTruth,v);
LAB_00433e1e:
    wVar3 = ~uVar5;
  }
LAB_00433e21:
  *pTruth = wVar3;
LAB_00433e24:
  p->nConsts = p->nConsts + 1;
  Dau_DsdWriteVar(p,pVars[v],0);
  pVars[v] = pVars[(long)nVars + -1];
  Abc_TtSwapVars(pTruth,nVars,v,nVars + -1);
  return 1;
}

Assistant:

static inline int Dau_Dsd6DecomposeSingleVarOne( Dau_Dsd_t * p, word * pTruth, int * pVars, int nVars, int v )
{
    // consider negative cofactors
    if ( pTruth[0] & 1 )
    {        
        if ( Abc_Tt6Cof0IsConst1( pTruth[0], v ) ) // !(ax)
        {
            Dau_DsdWriteString( p, "!(" );
            pTruth[0] = ~Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof0IsConst0( pTruth[0], v ) ) // ax
        {
            Dau_DsdWriteString( p, "(" );
            pTruth[0] = Abc_Tt6Cofactor1( pTruth[0], v );
            goto finish;            
        }
    }
    // consider positive cofactors
    if ( pTruth[0] >> 63 )
    {        
        if ( Abc_Tt6Cof1IsConst1( pTruth[0], v ) ) // !(!ax)
        {
            Dau_DsdWriteString( p, "!(!" );
            pTruth[0] = ~Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    else
    {
        if ( Abc_Tt6Cof1IsConst0( pTruth[0], v ) ) // !ax
        {
            Dau_DsdWriteString( p, "(!" );
            pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
            goto finish;            
        }
    }
    // consider equal cofactors
    if ( Abc_Tt6CofsOpposite( pTruth[0], v ) ) // [ax]
    {
        Dau_DsdWriteString( p, "[" );
        pTruth[0] = Abc_Tt6Cofactor0( pTruth[0], v );
        p->uConstMask |= (1 << p->nConsts);
        goto finish;            
    }
    return 0;

finish:
    p->nConsts++;
    Dau_DsdWriteVar( p, pVars[v], 0 );
    pVars[v] = pVars[nVars-1];
    Abc_TtSwapVars( pTruth, nVars, v, nVars-1 );
    return 1;
}